

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Main.cpp
# Opt level: O2

void __thiscall AReceiver::Handler(AReceiver *this,Event *ev)

{
  Type TVar1;
  ostream *poVar2;
  
  TVar1 = Event::GetType(ev);
  if (TVar1 == 2) {
    poVar2 = std::operator<<((ostream *)&std::cout,"[A] END");
  }
  else {
    if (TVar1 != 0) {
      return;
    }
    poVar2 = std::operator<<((ostream *)&std::cout,"[A] START: ");
    poVar2 = std::operator<<(poVar2,(string *)(ev + 1));
  }
  std::endl<char,std::char_traits<char>>(poVar2);
  return;
}

Assistant:

void Handler(Event *ev) {
            switch(ev->GetType()) {
                case Actions::A_STARTED: {
                    UserEvent<std::string> *msg = static_cast<UserEvent<std::string> *>(ev);
                    std::cout << "[A] START: " << msg->GetObject() << std::endl;
                } break;

                case Actions::A_ENDED: {
                    std::cout << "[A] END" << std::endl;
                } break;
            }
        }